

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_iter.cc
# Opt level: O0

void __thiscall leveldb::anon_unknown_3::DBIter::SeekToLast(DBIter *this)

{
  DBIter *this_local;
  
  this->direction_ = kReverse;
  ClearSavedValue(this);
  (*this->iter_->_vptr_Iterator[4])();
  FindPrevUserEntry(this);
  return;
}

Assistant:

void DBIter::SeekToLast() {
            direction_ = kReverse;
            ClearSavedValue();
            iter_->SeekToLast();
            FindPrevUserEntry();
        }